

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O1

void mult_verify::MultVerifyInt32Uint32(void)

{
  return;
}

Assistant:

void MultVerifyInt32Uint32()
{
	TestVector< std::int32_t, std::uint32_t, OpType::Mult > tests;
	TestCase<std::int32_t, std::uint32_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int32_t ret;
		if (SafeMultiply(test.x, test.y, ret) != test.fExpected)
		{
			//assert(false);
			err_msg("Error in case int_uint32: ", test.x, test.y, test.fExpected);
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int32_t> si(test.x);
			si *= test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			err_msg("Error in case int_uint32 throw: ", test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}